

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall cmNinjaNormalTargetGenerator::Generate(cmNinjaNormalTargetGenerator *this)

{
  TargetType TVar1;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  if ((this->TargetLinkLanguage)._M_string_length == 0) {
    __rhs = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    std::operator+(&bStack_28,"CMake can not determine linker language for target: ",__rhs);
    cmSystemTools::Error(&bStack_28);
    std::__cxx11::string::~string((string *)&bStack_28);
    return;
  }
  WriteLanguagesRules(this);
  cmNinjaTargetGenerator::WriteObjectBuildStatements(&this->super_cmNinjaTargetGenerator);
  TVar1 = cmGeneratorTarget::GetType
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (TVar1 == OBJECT_LIBRARY) {
    WriteObjectLibStatement(this);
    return;
  }
  WriteDeviceLinkStatement(this);
  WriteLinkStatement(this);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::Generate()
{
  if (this->TargetLinkLanguage.empty()) {
    cmSystemTools::Error("CMake can not determine linker language for "
                         "target: " +
                         this->GetGeneratorTarget()->GetName());
    return;
  }

  // Write the rules for each language.
  this->WriteLanguagesRules();

  // Write the build statements
  this->WriteObjectBuildStatements();

  if (this->GetGeneratorTarget()->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    this->WriteObjectLibStatement();
  } else {
    // If this target has cuda language link inputs, and we need to do
    // device linking
    this->WriteDeviceLinkStatement();
    this->WriteLinkStatement();
  }
}